

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpNotifyExt(UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,
                 IXML_Document *PropSet)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  char *ServName;
  char *DevID;
  Handle_Info *pHStack_30;
  int retVal;
  Handle_Info *SInfo;
  IXML_Document *PropSet_local;
  char *ServName_const_local;
  char *DevID_const_local;
  UpnpDevice_Handle Hnd_local;
  
  pHStack_30 = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    SInfo = (Handle_Info *)PropSet;
    PropSet_local = (IXML_Document *)ServName_const;
    ServName_const_local = DevID_const;
    DevID_const_local._0_4_ = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa6b,"Inside UpnpNotify \n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0xa6d);
    UVar1 = GetHandleInfo((UpnpDevice_Handle)DevID_const_local,&stack0xffffffffffffffd0);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa76);
        DevID_const_local._4_4_ = -0x65;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa7a);
        DevID_const_local._4_4_ = -0x65;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xa7e);
        iVar2 = genaNotifyAllExt((UpnpDevice_Handle)DevID_const_local,DevID_const,ServName_const,
                                 (IXML_Document *)SInfo);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa81,"Exiting UpnpNotify \n");
        DevID_const_local._4_4_ = iVar2;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xa72);
      DevID_const_local._4_4_ = -100;
    }
  }
  else {
    DevID_const_local._4_4_ = -0x74;
  }
  return DevID_const_local._4_4_;
}

Assistant:

int UpnpNotifyExt(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	IXML_Document *PropSet)
{
	struct Handle_Info *SInfo = NULL;
	int retVal;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpNotify \n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}

	HandleUnlock(__FILE__, __LINE__);
	retVal = genaNotifyAllExt(Hnd, DevID, ServName, PropSet);

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Exiting UpnpNotify \n");

	return retVal;
}